

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void wallwalk_right(level *lev,xchar x,xchar y,schar fgtyp,schar fglit,schar bgtyp,int chance)

{
  undefined1 *puVar1;
  char cVar2;
  boolean bVar3;
  uint uVar4;
  int iVar5;
  trap *ptVar6;
  byte x_00;
  byte y_00;
  byte bVar7;
  int iVar8;
  byte bVar9;
  
  if (((byte)y < 0x15 && (byte)(x - 1U) < 0x4f) && (lev->locations[(byte)x][(byte)y].typ == bgtyp))
  {
    iVar8 = 1;
    x_00 = x;
    y_00 = y;
    do {
      ptVar6 = t_at(lev,(int)(char)x_00,(int)(char)y_00);
      if ((ptVar6 == (trap *)0x0) && (bVar3 = bydoor(lev,x_00,y_00), bVar3 == '\0')) {
        if ((lev->locations[(char)x_00][(char)y_00].typ == bgtyp) &&
           (uVar4 = mt_random(), (int)(uVar4 % 100) <= chance)) {
          if (fgtyp < '\'') {
            lev->locations[(char)x_00][(char)y_00].typ = fgtyp;
          }
          if (fgtyp == '\x15') {
            puVar1 = &lev->locations[(char)x_00][(char)y_00].field_0x7;
            *puVar1 = *puVar1 | 4;
          }
          else if (fglit != -2) {
            if (fglit == -1) {
              uVar4 = mt_random();
              *(uint *)&lev->locations[(char)x_00][(char)y_00].field_0x6 =
                   *(uint *)&lev->locations[(char)x_00][(char)y_00].field_0x6 & 0xfffffbff |
                   (uVar4 & 1) << 10;
            }
            else {
              *(uint *)&lev->locations[(char)x_00][(char)y_00].field_0x6 =
                   *(uint *)&lev->locations[(char)x_00][(char)y_00].field_0x6 & 0xfffffbff |
                   (uint)(fglit & 1) << 10;
            }
          }
        }
      }
      iVar5 = 0;
      bVar9 = x_00;
      bVar7 = y_00;
      do {
        x_00 = bVar9;
        y_00 = bVar7;
        switch(iVar8 % 4) {
        case 0:
          y_00 = bVar7 - 1;
          break;
        case 1:
          x_00 = bVar9 + 1;
          break;
        case 2:
          y_00 = bVar7 + 1;
          break;
        case 3:
          x_00 = bVar9 - 1;
        }
        if ((y_00 < 0x15 && (byte)(x_00 - 1) < 0x4f) &&
           (cVar2 = lev->locations[x_00][y_00].typ, cVar2 == fgtyp || cVar2 == bgtyp)) {
          uVar4 = iVar8 + 6;
          if (-1 < (int)(iVar8 + 3U)) {
            uVar4 = iVar8 + 3U;
          }
          iVar8 = (iVar8 - (uVar4 & 0xfffffffc)) + 3;
        }
        else {
          iVar8 = iVar8 + 1;
          iVar5 = iVar5 + 1;
          x_00 = bVar9;
          y_00 = bVar7;
        }
      } while (((bVar9 == x_00) && (bVar7 == y_00)) && (bVar9 = x_00, bVar7 = y_00, iVar5 < 5));
    } while (y_00 != y || x_00 != x);
  }
  return;
}

Assistant:

void wallwalk_right(struct level *lev, xchar x, xchar y,
		    schar fgtyp, schar fglit, schar bgtyp, int chance)
{
	int sx, sy, nx, ny, dir, cnt;
	schar tmptyp;
	sx = x;
	sy = y;
	dir = 1;

	if (!isok(x,y)) return;
	if (lev->locations[x][y].typ != bgtyp) return;

	do {
	    if (!t_at(lev, x, y) && !bydoor(lev, x, y) &&
		lev->locations[x][y].typ == bgtyp && chance >= rn2(100)) {
		SET_TYPLIT(lev, x, y, fgtyp, fglit);
	    }
	    cnt = 0;
	    do {
		nx = x;
		ny = y;
		switch (dir % 4) {
		case 0: y--; break;
		case 1: x++; break;
		case 2: y++; break;
		case 3: x--; break;
		}
		if (isok(x, y)) {
		    tmptyp = lev->locations[x][y].typ;
		    if (tmptyp != bgtyp && tmptyp != fgtyp) {
			dir++;
			x = nx;
			y = ny;
			cnt++;
		    } else {
			dir = (dir + 3) % 4;
		    }
		} else {
		    dir++;
		    x = nx;
		    y = ny;
		    cnt++;
		}
	    } while (nx == x && ny == y && cnt < 5);
	} while (x != sx || y != sy);
}